

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::VarSourceVisitor::visit(VarSourceVisitor *this,Var *var)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  Var *var_00;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *set;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  long *plVar7;
  Var *local_30;
  Var *var_local;
  
  uVar1 = (this->map_)._M_h._M_bucket_count;
  uVar4 = (ulong)var % uVar1;
  p_Var5 = (this->map_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Var *)p_Var5->_M_nxt[1]._M_nxt != var)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Var *)p_Var2[1]._M_nxt == var)) goto LAB_001e96b4;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001e96b4:
  if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
    local_30 = var;
    iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x10])(var);
    plVar7 = *(long **)(CONCAT44(extraout_var,iVar3) + 0x10);
    if (plVar7 != (long *)0x0) {
      do {
        var_00 = *(Var **)(plVar7[1] + 200);
        set = std::__detail::
              _Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->map_,&local_30);
        get_source_var(var_00,set);
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
    }
  }
  return;
}

Assistant:

void visit(Var *var) override {
        if (map_.find(var) != map_.end()) return;
        auto const &sources = var->sources();
        for (auto const &stmt : sources) {
            auto *right = stmt->right();
            get_source_var(right, map_[var]);
        }
    }